

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

void __thiscall TCPConnection::StoreRxData(TCPConnection *this,DataBuffer *buffer)

{
  uint8_t uVar1;
  ushort uVar2;
  ulong uVar3;
  uint16_t uVar4;
  ushort uVar5;
  
  uVar5 = buffer->Length;
  uVar2 = this->CurrentWindow;
  if (uVar5 <= uVar2) {
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = this->RxInOffset;
      uVar3 = 0;
      do {
        uVar1 = buffer->Packet[uVar3];
        uVar5 = uVar4 + 1;
        this->RxInOffset = uVar5;
        this->RxBuffer[uVar4] = uVar1;
        uVar4 = uVar5;
        if (0xff < uVar5) {
          this->RxInOffset = 0;
          uVar4 = 0;
        }
        uVar3 = uVar3 + 1;
        uVar5 = buffer->Length;
      } while (uVar3 < uVar5);
    }
    this->CurrentWindow = uVar2 - uVar5;
    this->RxBufferEmpty = false;
    return;
  }
  printf("Rx window overrun, buffer %d, window %d\n",(ulong)uVar5);
  return;
}

Assistant:

void TCPConnection::StoreRxData(DataBuffer* buffer)
{
    uint16_t i;

    if (buffer->Length > CurrentWindow)
    {
        printf("Rx window overrun, buffer %d, window %d\n", buffer->Length, CurrentWindow);
        return;
    }

    for (i = 0; i < buffer->Length; i++)
    {
        RxBuffer[RxInOffset++] = buffer->Packet[i];
        if (RxInOffset >= TCP_RX_WINDOW_SIZE)
        {
            RxInOffset = 0;
        }
    }
    CurrentWindow -= buffer->Length;
    RxBufferEmpty = false;
}